

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

void __thiscall
QCborContainerPrivate::replaceAt_complex
          (QCborContainerPrivate *this,Element *e,QCborValue *value,ContainerDisposition disp)

{
  uint uVar1;
  QCborContainerPrivate *pQVar2;
  Element *pEVar3;
  ulong uVar4;
  Element *pEVar5;
  Type TVar6;
  ValueFlags VVar7;
  qptrdiff qVar8;
  char *pcVar9;
  qsizetype *pqVar10;
  long in_FS_OFFSET;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = value->container;
  if (value->n < 0) {
    if (pQVar2 == this) {
      replaceAt_complex();
    }
    else {
      (e->field_0).container = pQVar2;
      if (disp == CopyContainer) {
        LOCK();
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    e->type = value->t;
    (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 1;
  }
  else {
    pEVar3 = (pQVar2->elements).d.ptr + value->n;
    TVar6 = pEVar3->type;
    VVar7.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (pEVar3->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
    e->field_0 = pEVar3->field_0;
    e->type = TVar6;
    e->flags = (ValueFlags)
               VVar7.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
               super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    pcVar9 = (value->container->data).d.ptr;
    pEVar3 = (value->container->elements).d.ptr;
    pEVar5 = pEVar3 + value->n;
    uVar4._0_4_ = pEVar5->type;
    uVar4._4_4_ = pEVar5->flags;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    if ((uVar4 >> 0x21 & 1) != 0) {
      pqVar10 = (qsizetype *)
                ((ulong)(pcVar9 + pEVar3[value->n].field_0.value) & (long)(uVar4 << 0x1e) >> 0x3f);
      uVar1 = (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
              super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar1 & 0xfffffffd;
      if (value->container == this) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_58,(char *)(pqVar10 + 1),*pqVar10);
        compact(this);
        pcVar9 = local_58.d.ptr;
        if (local_58.d.ptr == (char *)0x0) {
          pcVar9 = "";
        }
        qVar8 = addByteDataImpl(&this->data,&this->usedData,pcVar9,local_58.d.size);
        (e->field_0).value = qVar8;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      else {
        compact(this);
        qVar8 = addByteDataImpl(&this->data,&this->usedData,(char *)(pqVar10 + 1),*pqVar10);
        (e->field_0).value = qVar8;
      }
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar1;
    }
    if (disp == MoveContainer) {
      deref(value->container);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborContainerPrivate::replaceAt_complex(Element &e, const QCborValue &value, ContainerDisposition disp)
{
    if (value.n < 0) {
        // This QCborValue is an array, map, or tagged value (container points
        // to itself).

        // detect self-assignment
        if (Q_UNLIKELY(this == value.container)) {
            Q_ASSERT(ref.loadRelaxed() >= 2);
            if (disp == MoveContainer)
                ref.deref();    // not deref() because it can't drop to 0
            QCborContainerPrivate *d = QCborContainerPrivate::clone(this);
            d->elements.detach();
            d->ref.storeRelaxed(1);
            e.container = d;
        } else {
            e.container = value.container;
            if (disp == CopyContainer)
                e.container->ref.ref();
        }

        e.type = value.type();
        e.flags = Element::IsContainer;
    } else {
        // String data, copy contents
        e = value.container->elements.at(value.n);

        // Copy string data, if any
        if (const ByteData *b = value.container->byteData(value.n)) {
            const auto flags = e.flags;
            // The element e has an invalid e.value, because it is copied from
            // value. It means that calling compact() will trigger an assertion
            // or just silently corrupt the data.
            // Temporarily unset the Element::HasByteData flag in order to skip
            // the element e in the call to compact().
            e.flags = e.flags & ~Element::HasByteData;
            if (this == value.container) {
                const QByteArray valueData = b->toByteArray();
                compact();
                e.value = addByteData(valueData, valueData.size());
            } else {
                compact();
                e.value = addByteData(b->byte(), b->len);
            }
            // restore the flags
            e.flags = flags;
        }

        if (disp == MoveContainer)
            value.container->deref();
    }
}